

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixTone.cpp
# Opt level: O2

void MakeWaveTables(void)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    dVar5 = sin((double)(int)lVar4 * 6.283184 * 0.00390625);
    gWaveModelTable[0][lVar4] = (char)(int)(dVar5 * 64.0);
  }
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
    gWaveModelTable[1][lVar4] = (char)lVar4;
  }
  cVar1 = '@';
  for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
    gWaveModelTable[1][lVar4 + 0x40] = cVar1;
    cVar1 = cVar1 + -1;
  }
  for (lVar4 = -0x40; lVar4 != 0; lVar4 = lVar4 + 1) {
    gWaveModelTable[2][lVar4] = (char)lVar4;
  }
  for (uVar3 = 0; uVar3 != 0x100; uVar3 = uVar3 + 1) {
    gWaveModelTable[2][uVar3] = (char)(uVar3 >> 1) + -0x40;
  }
  for (uVar3 = 0; uVar3 != 0x100; uVar3 = uVar3 + 1) {
    gWaveModelTable[3][uVar3] = '@' - (char)(uVar3 >> 1);
  }
  for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
    gWaveModelTable[4][lVar4] = '@';
  }
  for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
    gWaveModelTable[4][lVar4 + 0x80] = -0x40;
  }
  msvc_srand(0);
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    iVar2 = msvc_rand();
    gWaveModelTable[5][lVar4] = (char)iVar2 / '\x02';
  }
  return;
}

Assistant:

void MakeWaveTables(void)
{
	int i;

	int a;

	// Sine wave
	for (i = 0; i < 0x100; ++i)
	{
		gWaveModelTable[0][i] = (signed char)(sin((i * 6.283184) / 256.0) * 64.0);
		a = gWaveModelTable[0][i];	// I have no idea what this line was meant to do
	}

	// Triangle wave
	for (a = 0, i = 0; i < 0x40; ++i)
	{
		// Upwards
		gWaveModelTable[1][i] = (a * 0x40) / 0x40;
		++a;
	}
	for (a = 0; i < 0xC0; ++i)
	{
		// Downwards
		gWaveModelTable[1][i] = 0x40 - ((a * 0x40) / 0x40);
		++a;
	}
	for (a = 0; i < 0x100; ++i)
	{
		// Back up
		gWaveModelTable[1][i] = ((a * 0x40) / 0x40) - 0x40;
		++a;
	}

	// Saw up wave
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[2][i] = (i / 2) - 0x40;

	// Saw down wave
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[3][i] = 0x40 - (i / 2);

	// Square wave
	for (i = 0; i < 0x80; ++i)
		gWaveModelTable[4][i] = 0x40;
	for (; i < 0x100; ++i)
		gWaveModelTable[4][i] = -0x40;

	// White noise wave
	msvc_srand(0);
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[5][i] = (signed char)(msvc_rand() & 0xFF) / 2;
}